

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_lib.cpp
# Opt level: O0

string * skiwi::anon_unknown_28::read_file_in_module_path
                   (string *__return_storage_ptr__,string *relative_path)

{
  byte bVar1;
  streambuf *psVar2;
  ostream *poVar3;
  runtime_error *this;
  char *pcVar4;
  allocator<char> local_619;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_618;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_610;
  string local_608 [32];
  stringstream local_5e8 [8];
  stringstream ss2;
  ostream local_5d8 [376];
  stringstream local_460 [8];
  stringstream ss;
  undefined1 local_450 [376];
  undefined1 local_2d8 [8];
  ifstream f;
  undefined1 local_d0 [8];
  string filepath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_78;
  string local_58;
  undefined1 local_38 [8];
  string modulepath;
  string *relative_path_local;
  
  modulepath.field_2._8_8_ = relative_path;
  get_executable_path_abi_cxx11_();
  get_folder(&local_58,&local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"scm/",(allocator<char> *)(filepath.field_2._M_local_buf + 0xf));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)(filepath.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 modulepath.field_2._8_8_);
  std::ifstream::ifstream(local_2d8,local_d0,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::__cxx11::stringstream::stringstream(local_5e8);
    local_610._M_current = (char *)std::__cxx11::string::begin();
    local_618._M_current = (char *)std::__cxx11::string::end();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              (local_608,local_610,local_618,&local_619);
    poVar3 = std::operator<<(local_5d8,local_608);
    std::operator<<(poVar3," not found");
    std::__cxx11::string::~string(local_608);
    std::allocator<char>::~allocator(&local_619);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::runtime_error::runtime_error(this,pcVar4);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::stringstream::stringstream(local_460);
  psVar2 = (streambuf *)std::ifstream::rdbuf();
  std::ostream::operator<<(local_450,psVar2);
  std::ifstream::close();
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_460);
  std::ifstream::~ifstream(local_2d8);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string read_file_in_module_path(const std::string& relative_path)
    {
    std::string modulepath = get_folder(get_executable_path()) + std::string("scm/");
    std::string filepath = modulepath + relative_path;
#ifdef _WIN32
    std::wstring wfilepath = convert_string_to_wstring(filepath);
    std::ifstream f{ wfilepath };
#else
    std::ifstream f{ filepath };
#endif
    if (f.is_open())
      {
      std::stringstream ss;
      ss << f.rdbuf();
      f.close();
      return ss.str();
      }
    std::stringstream ss2;
    ss2 << std::string(filepath.begin(), filepath.end()) << " not found";
    throw std::runtime_error(ss2.str().c_str());
    return "";
    }